

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::Node<QNetworkReply*,QRestAccessManagerPrivate::CallerInfo>::
emplaceValue<QRestAccessManagerPrivate::CallerInfo_const&>
          (Node<QNetworkReply*,QRestAccessManagerPrivate::CallerInfo> *this,CallerInfo *args)

{
  long in_FS_OFFSET;
  CallerInfo local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QRestAccessManagerPrivate::CallerInfo::CallerInfo(&local_30,args);
  QRestAccessManagerPrivate::CallerInfo::operator=((CallerInfo *)(this + 8),&local_30);
  QRestAccessManagerPrivate::CallerInfo::~CallerInfo(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }